

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ToObject(JSContext *ctx,JSValue val)

{
  uint uVar1;
  int class_id;
  JSValueUnion JVar2;
  JSRefCountHeader *p;
  JSValue this_obj;
  
  JVar2 = val.u;
  uVar1 = (uint)val.tag;
  switch(uVar1) {
  case 0:
  case 7:
    class_id = 4;
    break;
  case 1:
    this_obj = JS_NewObjectClass(ctx,6);
    if ((int)this_obj.tag == 6) {
      return this_obj;
    }
    goto LAB_0011c76c;
  case 0xfffffff8:
    class_id = 7;
    break;
  case 0xfffffff9:
    this_obj = JS_NewObjectClass(ctx,5);
    JS_DefinePropertyValue
              (ctx,this_obj,0x30,
               (JSValue)ZEXT416((uint)*(undefined8 *)((long)JVar2.ptr + 4) & 0x7fffffff),0);
    goto LAB_0011c75e;
  default:
    JS_ThrowTypeError(ctx,"cannot convert to object");
    return (JSValue)(ZEXT816(6) << 0x40);
  case 0xffffffff:
  case 6:
    if (uVar1 < 0xfffffff5) {
      return val;
    }
    *(int *)JVar2.ptr = *JVar2.ptr + 1;
    return val;
  }
  this_obj = JS_NewObjectClass(ctx,class_id);
LAB_0011c75e:
  if ((int)this_obj.tag != 6) {
    if (0xfffffff4 < uVar1) {
      *(int *)JVar2.ptr = *JVar2.ptr + 1;
    }
LAB_0011c76c:
    JS_SetObjectData(ctx,this_obj,val);
  }
  return this_obj;
}

Assistant:

static JSValue JS_ToObject(JSContext *ctx, JSValueConst val)
{
    int tag = JS_VALUE_GET_NORM_TAG(val);
    JSValue obj;

    switch(tag) {
    default:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        return JS_ThrowTypeError(ctx, "cannot convert to object");
    case JS_TAG_OBJECT:
    case JS_TAG_EXCEPTION:
        return JS_DupValue(ctx, val);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BIG_INT);
        goto set_value;
    case JS_TAG_BIG_FLOAT:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BIG_FLOAT);
        goto set_value;
    case JS_TAG_BIG_DECIMAL:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BIG_DECIMAL);
        goto set_value;
#endif
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
        obj = JS_NewObjectClass(ctx, JS_CLASS_NUMBER);
        goto set_value;
    case JS_TAG_STRING:
        /* XXX: should call the string constructor */
        {
            JSString *p1 = JS_VALUE_GET_STRING(val);
            obj = JS_NewObjectClass(ctx, JS_CLASS_STRING);
            JS_DefinePropertyValue(ctx, obj, JS_ATOM_length, JS_NewInt32(ctx, p1->len), 0);
        }
        goto set_value;
    case JS_TAG_BOOL:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BOOLEAN);
        goto set_value;
    case JS_TAG_SYMBOL:
        obj = JS_NewObjectClass(ctx, JS_CLASS_SYMBOL);
    set_value:
        if (!JS_IsException(obj))
            JS_SetObjectData(ctx, obj, JS_DupValue(ctx, val));
        return obj;
    }
}